

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADE_DEP_DPFSP.cpp
# Opt level: O0

void __thiscall ADE_DEP_DPFSP::normalizza(ADE_DEP_DPFSP *this,Permutazione *p)

{
  undefined2 uVar1;
  unsigned_short uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  ushort uVar6;
  ushort uVar7;
  ulong uVar8;
  unsigned_short *puVar9;
  void *pvVar10;
  ushort local_4c;
  ushort local_4a;
  unsigned_short dimensioneFabbrica;
  unsigned_short i_2;
  unsigned_short posizione;
  unsigned_short *nuovoIndividuo;
  ushort local_36;
  unsigned_short tmp;
  unsigned_short ind2;
  unsigned_short ind1;
  unsigned_short j;
  unsigned_short i_1;
  ushort uStack_2a;
  bool cambiamento;
  unsigned_short i;
  unsigned_short f;
  unsigned_short valoreMinimo;
  unsigned_short incremento;
  unsigned_short *indiciFabbriche;
  unsigned_short *valoriMinimiF;
  Permutazione *p_local;
  ADE_DEP_DPFSP *this_local;
  
  auVar4 = ZEXT216((this->istanza).fabbriche) * ZEXT816(2);
  uVar8 = auVar4._0_8_;
  if (auVar4._8_8_ != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  valoriMinimiF = (unsigned_short *)p;
  p_local = (Permutazione *)this;
  indiciFabbriche = (unsigned_short *)operator_new__(uVar8);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)(int)((uint)(this->istanza).fabbriche << 1);
  uVar8 = SUB168(auVar4 * ZEXT816(2),0);
  if (SUB168(auVar4 * ZEXT816(2),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  _i = (undefined2 *)operator_new__(uVar8);
  *_i = 0;
  _i[(int)((uint)(this->istanza).fabbriche * 2 + -1)] = valoriMinimiF[8] - 1;
  uStack_2a = 0;
  i_1 = 0xffff;
  j = 0;
  for (ind1 = 0; ind1 < valoriMinimiF[8]; ind1 = ind1 + 1) {
    if (*(ushort *)(*(long *)(valoriMinimiF + 4) + (ulong)ind1 * 2) < (this->istanza).lavori) {
      puVar9 = std::min<unsigned_short>
                         (&i_1,(unsigned_short *)(*(long *)(valoriMinimiF + 4) + (ulong)ind1 * 2));
      i_1 = *puVar9;
    }
    else {
      indiciFabbriche[j] = i_1;
      i_1 = 0xffff;
      _i[(ushort)(uStack_2a + 1)] = ind1 - 1;
      uStack_2a = uStack_2a + 2;
      _i[uStack_2a] = ind1 + 1;
      j = j + 1;
    }
  }
  indiciFabbriche[j] = i_1;
  bVar5 = false;
  for (tmp = 0; local_36 = tmp, (int)(uint)tmp < (int)((this->istanza).fabbriche - 1); tmp = tmp + 1
      ) {
    while (local_36 = local_36 + 1, local_36 < (this->istanza).fabbriche) {
      if (indiciFabbriche[local_36] < indiciFabbriche[tmp]) {
        bVar5 = true;
        uVar7 = tmp * 2;
        uVar6 = local_36 * 2;
        uVar1 = _i[uVar7];
        _i[uVar7] = _i[uVar6];
        _i[uVar6] = uVar1;
        uVar1 = _i[(ushort)(uVar7 + 1)];
        _i[(ushort)(uVar7 + 1)] = _i[(ushort)(uVar6 + 1)];
        _i[(ushort)(uVar6 + 1)] = uVar1;
        uVar2 = indiciFabbriche[tmp];
        indiciFabbriche[tmp] = indiciFabbriche[local_36];
        indiciFabbriche[local_36] = uVar2;
      }
    }
  }
  if (bVar5) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)(int)((uint)(this->istanza).lavori + (uint)(this->istanza).fabbriche + -1);
    uVar8 = SUB168(auVar3 * ZEXT816(2),0);
    if (SUB168(auVar3 * ZEXT816(2),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    pvVar10 = operator_new__(uVar8);
    local_4a = 0;
    for (local_4c = 0; local_4c < (this->istanza).fabbriche; local_4c = local_4c + 1) {
      uVar7 = (_i[(int)((uint)local_4c * 2 + 1)] - _i[(int)((uint)local_4c << 1)]) + 1;
      if (uVar7 != 0) {
        memcpy((void *)((long)pvVar10 + (ulong)local_4a * 2),
               (void *)(*(long *)(valoriMinimiF + 4) +
                       (ulong)(ushort)_i[(int)((uint)local_4c << 1)] * 2),(ulong)uVar7 << 1);
        local_4a = local_4a + uVar7;
      }
      if ((uint)local_4c != (this->istanza).fabbriche - 1) {
        *(unsigned_short *)((long)pvVar10 + (ulong)local_4a * 2) = (this->istanza).lavori + local_4c
        ;
        local_4a = local_4a + 1;
      }
    }
    if (*(void **)(valoriMinimiF + 4) != (void *)0x0) {
      operator_delete__(*(void **)(valoriMinimiF + 4));
    }
    *(void **)(valoriMinimiF + 4) = pvVar10;
  }
  if (indiciFabbriche != (unsigned_short *)0x0) {
    operator_delete__(indiciFabbriche);
  }
  if (_i != (undefined2 *)0x0) {
    operator_delete__(_i);
  }
  return;
}

Assistant:

void ADE_DEP_DPFSP::normalizza(Permutazione* p) {
	unsigned short* valoriMinimiF = new unsigned short[istanza.fabbriche];
	unsigned short* indiciFabbriche = new unsigned short[istanza.fabbriche * 2];

	indiciFabbriche[0] = 0;
	indiciFabbriche[istanza.fabbriche * 2 - 1] = p->dimensione - 1;

	unsigned short incremento = 0;

	unsigned short valoreMinimo = UINT16_MAX;
	unsigned short f = 0;

	for (unsigned short i = 0; i < p->dimensione; i++) {
		if (p->individuo[i] >= istanza.lavori) {
			valoriMinimiF[f++] = valoreMinimo;
			valoreMinimo = UINT16_MAX;
			indiciFabbriche[++incremento] = i - 1;
			indiciFabbriche[++incremento] = i + 1;
		}
		else {
			valoreMinimo = min(valoreMinimo, p->individuo[i]);
		}
	}
	valoriMinimiF[f] = valoreMinimo;

	bool cambiamento = false;
	for (unsigned short i = 0; i < istanza.fabbriche - 1; i++) {
		for (unsigned short j = i + 1; j < istanza.fabbriche; j++) {
			if (valoriMinimiF[i] > valoriMinimiF[j]) {

				cambiamento = true;

				unsigned short ind1 = 2 * i;
				unsigned short ind2 = 2 * j;

				//scambia indici fabbriche
				unsigned short tmp = indiciFabbriche[ind1];
				indiciFabbriche[ind1] = indiciFabbriche[ind2];
				indiciFabbriche[ind2] = tmp;

				ind1++, ind2++;
				tmp = indiciFabbriche[ind1];
				indiciFabbriche[ind1] = indiciFabbriche[ind2];
				indiciFabbriche[ind2] = tmp;

				//scambia indici minimi
				tmp = valoriMinimiF[i];
				valoriMinimiF[i] = valoriMinimiF[j];
				valoriMinimiF[j] = tmp;
			}
		}
	}

	if (cambiamento) {
		unsigned short* nuovoIndividuo = new unsigned short[istanza.lavori + istanza.fabbriche - 1];

		unsigned short posizione = 0;

		for (unsigned short i = 0; i < istanza.fabbriche; i++) {

			unsigned short dimensioneFabbrica = indiciFabbriche[2 * i + 1] - indiciFabbriche[2 * i] + 1;
			if (dimensioneFabbrica > 0) {
				memcpy(&nuovoIndividuo[posizione], &p->individuo[indiciFabbriche[2 * i]], 
					dimensioneFabbrica * sizeof(unsigned short));

				posizione += dimensioneFabbrica;
			}

			if(i!=istanza.fabbriche - 1)
				nuovoIndividuo[posizione++] = istanza.lavori + i;
		}

		delete[] p->individuo;
		p->individuo = nuovoIndividuo;
	}

	delete[] valoriMinimiF;
	delete[] indiciFabbriche;
}